

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fcntlSizeHint(unixFile *pFile,i64 nByte)

{
  int iVar1;
  int *piVar2;
  long lStack_c8;
  int rc;
  i64 iWrite;
  int nWrite;
  int nBlk;
  stat buf;
  i64 nSize;
  i64 nByte_local;
  unixFile *pFile_local;
  
  if (0 < pFile->szChunk) {
    iVar1 = (*aSyscall[5].pCurrent)((ulong)(uint)pFile->h,&nWrite);
    if (iVar1 != 0) {
      return 0x70a;
    }
    buf.__glibc_reserved[2] =
         ((nByte + pFile->szChunk + -1) / (long)pFile->szChunk) * (long)pFile->szChunk;
    if ((long)buf.st_rdev < buf.__glibc_reserved[2]) {
      for (lStack_c8 = ((long)buf.st_rdev / (long)(int)buf.st_size) * (long)(int)buf.st_size +
                       (long)(int)buf.st_size + -1;
          lStack_c8 < buf.__glibc_reserved[2] + (int)buf.st_size + -1;
          lStack_c8 = (int)buf.st_size + lStack_c8) {
        if (buf.__glibc_reserved[2] <= lStack_c8) {
          lStack_c8 = buf.__glibc_reserved[2] + -1;
        }
        iVar1 = seekAndWrite(pFile,lStack_c8,"",1);
        if (iVar1 != 1) {
          return 0x30a;
        }
      }
    }
  }
  if ((pFile->mmapSizeMax < 1) || (nByte <= pFile->mmapSize)) {
    pFile_local._4_4_ = 0;
  }
  else if ((pFile->szChunk < 1) && (iVar1 = robust_ftruncate(pFile->h,nByte), iVar1 != 0)) {
    piVar2 = __errno_location();
    storeLastErrno(pFile,*piVar2);
    pFile_local._4_4_ = unixLogErrorAtLine(0x60a,"ftruncate",pFile->zPath,0xa282);
  }
  else {
    pFile_local._4_4_ = unixMapfile(pFile,nByte);
  }
  return pFile_local._4_4_;
}

Assistant:

static int fcntlSizeHint(unixFile *pFile, i64 nByte){
  if( pFile->szChunk>0 ){
    i64 nSize;                    /* Required file size */
    struct stat buf;              /* Used to hold return values of fstat() */

    if( osFstat(pFile->h, &buf) ){
      return SQLITE_IOERR_FSTAT;
    }

    nSize = ((nByte+pFile->szChunk-1) / pFile->szChunk) * pFile->szChunk;
    if( nSize>(i64)buf.st_size ){

#if defined(HAVE_POSIX_FALLOCATE) && HAVE_POSIX_FALLOCATE
      /* The code below is handling the return value of osFallocate()
      ** correctly. posix_fallocate() is defined to "returns zero on success,
      ** or an error number on  failure". See the manpage for details. */
      int err;
      do{
        err = osFallocate(pFile->h, buf.st_size, nSize-buf.st_size);
      }while( err==EINTR );
      if( err && err!=EINVAL ) return SQLITE_IOERR_WRITE;
#else
      /* If the OS does not have posix_fallocate(), fake it. Write a
      ** single byte to the last byte in each block that falls entirely
      ** within the extended region. Then, if required, a single byte
      ** at offset (nSize-1), to set the size of the file correctly.
      ** This is a similar technique to that used by glibc on systems
      ** that do not have a real fallocate() call.
      */
      int nBlk = buf.st_blksize;  /* File-system block size */
      int nWrite = 0;             /* Number of bytes written by seekAndWrite */
      i64 iWrite;                 /* Next offset to write to */

      iWrite = (buf.st_size/nBlk)*nBlk + nBlk - 1;
      assert( iWrite>=buf.st_size );
      assert( ((iWrite+1)%nBlk)==0 );
      for(/*no-op*/; iWrite<nSize+nBlk-1; iWrite+=nBlk ){
        if( iWrite>=nSize ) iWrite = nSize - 1;
        nWrite = seekAndWrite(pFile, iWrite, "", 1);
        if( nWrite!=1 ) return SQLITE_IOERR_WRITE;
      }
#endif
    }
  }

#if SQLITE_MAX_MMAP_SIZE>0
  if( pFile->mmapSizeMax>0 && nByte>pFile->mmapSize ){
    int rc;
    if( pFile->szChunk<=0 ){
      if( robust_ftruncate(pFile->h, nByte) ){
        storeLastErrno(pFile, errno);
        return unixLogError(SQLITE_IOERR_TRUNCATE, "ftruncate", pFile->zPath);
      }
    }

    rc = unixMapfile(pFile, nByte);
    return rc;
  }
#endif

  return SQLITE_OK;
}